

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BeginTooltip(void)

{
  float fVar1;
  ImGuiIO *pIVar2;
  ImVec2 local_28;
  ImVec2 local_20;
  ImVec2 local_18;
  ImVec2 tooltip_pos;
  ImGuiContext *g;
  
  tooltip_pos = (ImVec2)GImGui;
  if ((GImGui->DragDropWithinSourceOrTarget & 1U) == 0) {
    BeginTooltipEx(0,false);
  }
  else {
    pIVar2 = &GImGui->IO;
    fVar1 = (GImGui->Style).MouseCursorScale;
    ImVec2::ImVec2(&local_20,fVar1 * 16.0,fVar1 * 8.0);
    local_18 = ::operator+(&pIVar2->MousePos,&local_20);
    ImVec2::ImVec2(&local_28,0.0,0.0);
    SetNextWindowPos(&local_18,0,&local_28);
    SetNextWindowBgAlpha(*(float *)((long)tooltip_pos + 0x1664) * 0.6);
    BeginTooltipEx(0,true);
  }
  return;
}

Assistant:

void ImGui::BeginTooltip()
{
    ImGuiContext& g = *GImGui;
    if (g.DragDropWithinSourceOrTarget)
    {
        // The default tooltip position is a little offset to give space to see the context menu (it's also clamped within the current viewport/monitor)
        // In the context of a dragging tooltip we try to reduce that offset and we enforce following the cursor.
        // Whatever we do we want to call SetNextWindowPos() to enforce a tooltip position and disable clipping the tooltip without our display area, like regular tooltip do.
        //ImVec2 tooltip_pos = g.IO.MousePos - g.ActiveIdClickOffset - g.Style.WindowPadding;
        ImVec2 tooltip_pos = g.IO.MousePos + ImVec2(16 * g.Style.MouseCursorScale, 8 * g.Style.MouseCursorScale);
        SetNextWindowPos(tooltip_pos);
        SetNextWindowBgAlpha(g.Style.Colors[ImGuiCol_PopupBg].w * 0.60f);
        //PushStyleVar(ImGuiStyleVar_Alpha, g.Style.Alpha * 0.60f); // This would be nice but e.g ColorButton with checkboard has issue with transparent colors :(
        BeginTooltipEx(0, true);
    }
    else
    {
        BeginTooltipEx(0, false);
    }
}